

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O3

bool __thiscall index::find_value(index *this,wchar_t key,wchar_t value)

{
  _Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> iter;
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> _Var1;
  bool bVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  pVar3;
  wchar_t local_c;
  
  local_c = key;
  pVar3 = std::
          _Hashtable<wchar_t,_std::pair<const_wchar_t,_character>,_std::allocator<std::pair<const_wchar_t,_character>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range((_Hashtable<wchar_t,_std::pair<const_wchar_t,_character>,_std::allocator<std::pair<const_wchar_t,_character>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                         *)this,&local_c);
  _Var1._M_cur = (__node_type *)
                 pVar3.first.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>.
                 _M_cur;
  if ((_Node_iterator_base<std::pair<const_wchar_t,_character>,_false>)_Var1._M_cur ==
      pVar3.second.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>._M_cur.
      super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = *(wchar_t *)
               ((long)&((_Var1._M_cur)->
                       super__Hash_node_value<std::pair<const_wchar_t,_character>,_false>).
                       super__Hash_node_value_base<std::pair<const_wchar_t,_character>_>._M_storage.
                       _M_storage + 8) == value;
      if (bVar2) {
        return bVar2;
      }
      _Var1._M_cur = (__node_type *)((_Var1._M_cur)->super__Hash_node_base)._M_nxt;
    } while ((_Node_iterator_base<std::pair<const_wchar_t,_character>,_false>)_Var1._M_cur !=
             pVar3.second.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>.
             _M_cur.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>);
  }
  return bVar2;
}

Assistant:

bool index::find_value(wchar_t key, wchar_t value)
{
    auto range = index_.equal_range(key);
    for (auto iter = range.first; iter != range.second; ++iter)
    {
        if (iter->second.value == value)
        {
            return true;
        }
    }
    return false;
}